

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O1

void __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::PrettyPrefix(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *this,Type type)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  Stack<rapidjson::CrtAllocator> *pSVar5;
  
  pcVar1 = (this->
           super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.stackTop_;
  if (pcVar1 == (this->
                super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                ).level_stack_.stack_) {
    (this->
    super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ).hasRoot_ = true;
    return;
  }
  if (pcVar1[-8] == '\x01') {
    pcVar1[-7] = type - kStringType < 0xfffffffe & (char)this->formatOptions_;
    if (*(long *)(pcVar1 + -0x10) != 0) {
      pSVar5 = &((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_)->stack_;
      if (pSVar5->stackEnd_ == pSVar5->stackTop_ ||
          (long)pSVar5->stackEnd_ - (long)pSVar5->stackTop_ < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar5,1);
      }
      pcVar2 = pSVar5->stackTop_;
      pSVar5->stackTop_ = pcVar2 + 1;
      *pcVar2 = ',';
      if (pcVar1[-7] == '\x01') {
        pSVar5 = &((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_)->stack_;
        if (pSVar5->stackEnd_ == pSVar5->stackTop_ ||
            (long)pSVar5->stackEnd_ - (long)pSVar5->stackTop_ < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar5,1);
        }
        pcVar2 = pSVar5->stackTop_;
        pSVar5->stackTop_ = pcVar2 + 1;
        *pcVar2 = ' ';
      }
    }
    if (pcVar1[-7] != '\0') goto LAB_00154250;
    pSVar5 = &((this->
               super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               ).os_)->stack_;
    if (pSVar5->stackEnd_ == pSVar5->stackTop_ ||
        (long)pSVar5->stackEnd_ - (long)pSVar5->stackTop_ < 0) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar5,1);
    }
    pcVar2 = pSVar5->stackTop_;
    pSVar5->stackTop_ = pcVar2 + 1;
    *pcVar2 = '\n';
  }
  else {
    if (*(ulong *)(pcVar1 + -0x10) == 0) {
LAB_001541f1:
      pSVar5 = &((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_)->stack_;
      lVar3 = (long)pSVar5->stackEnd_ - (long)pSVar5->stackTop_;
      cVar4 = '\n';
    }
    else {
      pSVar5 = &((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_)->stack_;
      lVar3 = (long)pSVar5->stackEnd_ - (long)pSVar5->stackTop_;
      if ((*(ulong *)(pcVar1 + -0x10) & 1) == 0) {
        if (lVar3 < 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar5,1);
        }
        pcVar2 = pSVar5->stackTop_;
        pSVar5->stackTop_ = pcVar2 + 1;
        *pcVar2 = ',';
        goto LAB_001541f1;
      }
      if (pSVar5->stackEnd_ == pSVar5->stackTop_ || lVar3 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar5,1);
      }
      pcVar2 = pSVar5->stackTop_;
      pSVar5->stackTop_ = pcVar2 + 1;
      *pcVar2 = ':';
      pSVar5 = &((this->
                 super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 ).os_)->stack_;
      lVar3 = (long)pSVar5->stackEnd_ - (long)pSVar5->stackTop_;
      cVar4 = ' ';
    }
    if (lVar3 < 1) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar5,1);
    }
    pcVar2 = pSVar5->stackTop_;
    pSVar5->stackTop_ = pcVar2 + 1;
    *pcVar2 = cVar4;
    if ((pcVar1[-0x10] & 1U) != 0) goto LAB_00154250;
  }
  WriteIndent(this);
LAB_00154250:
  *(long *)(pcVar1 + -0x10) = *(long *)(pcVar1 + -0x10) + 1;
  return;
}

Assistant:

void PrettyPrefix(Type type) {
        (void)type;
        if (Base::level_stack_.GetSize() != 0) { // this value is not at root
            typename Base::Level* level = Base::level_stack_.template Top<typename Base::Level>();

            if (level->inArray) {
                level->inLine = (formatOptions_ & kFormatSingleLineArray) && type != kObjectType && type != kArrayType;

                if (level->valueCount > 0) {
                    Base::os_->Put(','); // add comma if it is not the first element in array
                    if (level->inLine) {
                        Base::os_->Put(' ');
                    }
                }

                if (!level->inLine) {
                    Base::os_->Put('\n');
                    WriteIndent();
                }
            }
            else {  // in object
                if (level->valueCount > 0) {
                    if (level->valueCount % 2 == 0) {
                        Base::os_->Put(',');
                        Base::os_->Put('\n');
                    }
                    else {
                        Base::os_->Put(':');
                        Base::os_->Put(' ');
                    }
                }
                else
                    Base::os_->Put('\n');

                if (level->valueCount % 2 == 0)
                    WriteIndent();
            }
            if (!level->inArray && level->valueCount % 2 == 0)
                RAPIDJSON_ASSERT(type == kStringType);  // if it's in object, then even number should be a name
            level->valueCount++;
        }
        else {
            RAPIDJSON_ASSERT(!Base::hasRoot_);  // Should only has one and only one root.
            Base::hasRoot_ = true;
        }
    }